

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.cc
# Opt level: O0

char * __thiscall
google::protobuf::internal::EpsCopyInputStream::ReadStringFallback
          (EpsCopyInputStream *this,char *ptr,int size,string *str)

{
  char *pcVar1;
  ulong in_RCX;
  int in_EDX;
  long in_RSI;
  long in_RDI;
  anon_class_8_1_ba1d7991 *in_stack_00000020;
  undefined4 in_stack_00000030;
  int local_24;
  ulong local_20;
  int local_14;
  long local_10;
  
  local_20 = in_RCX;
  local_14 = in_EDX;
  local_10 = in_RSI;
  std::__cxx11::string::clear();
  if ((long)local_14 <= (*(long *)(in_RDI + 8) - local_10) + (long)*(int *)(in_RDI + 0x1c)) {
    std::__cxx11::string::size();
    local_24 = 50000000;
    std::min<int>(&local_14,&local_24);
    std::__cxx11::string::reserve(local_20);
  }
  pcVar1 = AppendSize<google::protobuf::internal::EpsCopyInputStream::ReadStringFallback(char_const*,int,std::__cxx11::string*)::__0>
                     ((EpsCopyInputStream *)ptr,(char *)CONCAT44(size,in_stack_00000030),str._4_4_,
                      in_stack_00000020);
  return pcVar1;
}

Assistant:

const char* EpsCopyInputStream::ReadStringFallback(const char* ptr, int size,
                                                   std::string* str) {
  str->clear();
  if (PROTOBUF_PREDICT_TRUE(size <= buffer_end_ - ptr + limit_)) {
    // Reserve the string up to a static safe size. If strings are bigger than
    // this we proceed by growing the string as needed. This protects against
    // malicious payloads making protobuf hold on to a lot of memory.
    str->reserve(str->size() + std::min<int>(size, kSafeStringSize));
  }
  return AppendSize(ptr, size,
                    [str](const char* p, int s) { str->append(p, s); });
}